

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# droplayer.cpp
# Opt level: O2

UINT8 __thiscall DROPlayer::SetDeviceMuting(DROPlayer *this,UINT32 id,PLR_MUTE_OPTS *muteOpts)

{
  DROPlayer *this_00;
  pointer pDVar1;
  PLR_DEV_OPTS *pPVar2;
  undefined3 uVar3;
  UINT32 UVar4;
  UINT8 UVar5;
  size_t sVar6;
  
  sVar6 = DeviceID2OptionID(this,id);
  if (sVar6 == 0xffffffffffffffff) {
    UVar5 = 0x80;
  }
  else {
    this->_devOpts[sVar6].muteOpts.chnMute[1] = muteOpts->chnMute[1];
    uVar3 = *(undefined3 *)&muteOpts->field_0x1;
    UVar4 = muteOpts->chnMute[0];
    pPVar2 = this->_devOpts + sVar6;
    (pPVar2->muteOpts).disable = muteOpts->disable;
    *(undefined3 *)&(pPVar2->muteOpts).field_0x1 = uVar3;
    (pPVar2->muteOpts).chnMute[0] = UVar4;
    this_00 = (DROPlayer *)this->_optDevMap[sVar6];
    pDVar1 = (this->_devices).
             super__Vector_base<DROPlayer::DRO_CHIPDEV,_std::allocator<DROPlayer::DRO_CHIPDEV>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (this_00 < (DROPlayer *)
                  (((long)(this->_devices).
                          super__Vector_base<DROPlayer::DRO_CHIPDEV,_std::allocator<DROPlayer::DRO_CHIPDEV>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar1) / 0xa8)) {
      RefreshMuting(this_00,pDVar1 + (long)this_00,&this->_devOpts[sVar6].muteOpts);
    }
    UVar5 = '\0';
  }
  return UVar5;
}

Assistant:

UINT8 DROPlayer::SetDeviceMuting(UINT32 id, const PLR_MUTE_OPTS& muteOpts)
{
	size_t optID = DeviceID2OptionID(id);
	if (optID == (size_t)-1)
		return 0x80;	// bad device ID
	
	_devOpts[optID].muteOpts = muteOpts;
	
	size_t devID = _optDevMap[optID];
	if (devID < _devices.size())
		RefreshMuting(_devices[devID], _devOpts[optID].muteOpts);
	return 0x00;
}